

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RefCountedObject.h
# Opt level: O0

void soul::RefCountedPtr<soul::Structure>::decIfNotNull(Structure *o)

{
  uint32_t uVar1;
  Structure *o_local;
  
  if (o != (Structure *)0x0) {
    checkAssertion((o->super_RefCountedObject).refCount != 0,"o->refCount > 0","decIfNotNull",0x69);
    uVar1 = (o->super_RefCountedObject).refCount - 1;
    (o->super_RefCountedObject).refCount = uVar1;
    if ((uVar1 == 0) && (o != (Structure *)0x0)) {
      Structure::~Structure(o);
      operator_delete(o,0x288);
    }
  }
  return;
}

Assistant:

static void decIfNotNull (ObjectType* o)
    {
        if (o != nullptr)
        {
            SOUL_ASSERT (o->refCount > 0);

            if (--(o->refCount) == 0)
                delete o;
        }
    }